

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

idx_t __thiscall
duckdb::DataTable::Delete
          (DataTable *this,TableDeleteState *state,ClientContext *context,Vector *row_identifiers,
          idx_t count)

{
  DataChunk *result;
  row_t *ids;
  long lVar1;
  data_ptr_t pdVar2;
  long lVar3;
  TransactionData transaction;
  DuckTransaction *this_00;
  LocalStorage *this_01;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  ulong uVar4;
  idx_t iVar5;
  RowGroupCollection *this_02;
  idx_t end;
  idx_t iVar6;
  ColumnFetchState fetch_state;
  Vector offset_ids;
  idx_t local_158;
  ColumnFetchState local_100;
  TransactionData local_b0;
  Vector local_98;
  
  if (count == 0) {
    local_158 = 0;
  }
  else {
    this_00 = DuckTransaction::Get(context,this->db);
    this_01 = DuckTransaction::GetLocalStorage(this_00);
    storage = LocalTableManager::GetStorage(&this_01->table_manager,this);
    Vector::Flatten(row_identifiers,count);
    pdVar2 = row_identifiers->data;
    result = &state->verify_chunk;
    local_158 = 0;
    iVar5 = 0;
    do {
      uVar4 = iVar5 + 1;
      if (iVar5 + 1 < count) {
        uVar4 = count;
      }
      ids = (row_t *)(pdVar2 + iVar5 * 8);
      lVar3 = *ids;
      iVar6 = iVar5;
      do {
        end = uVar4;
        if (uVar4 - 1 == iVar6) break;
        lVar1 = iVar6 * 8;
        end = iVar6 + 1;
        iVar6 = end;
      } while (*(long *)(pdVar2 + lVar1 + 8) < 0x7ffffffffff080 != 0x7ffffffffff07f < lVar3);
      iVar6 = end - iVar5;
      Vector::Vector(&local_98,row_identifiers,iVar5,end);
      if (lVar3 < 0x7ffffffffff080) {
        if (state->has_delete_constraints == true) {
          local_100.handles._M_h._M_buckets = &local_100.handles._M_h._M_single_bucket;
          local_100.handles._M_h._M_bucket_count = 1;
          local_100.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_100.handles._M_h._M_element_count = 0;
          local_100.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_100.child_states.
          super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_100.child_states.
          super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_100.handles._M_h._M_rehash_policy._M_next_resize = 0;
          local_100.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
          local_100.child_states.
          super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Fetch(this,this_00,result,&state->col_ids,&local_98,iVar6,&local_100);
          VerifyDeleteConstraints(this,storage,state,context,result);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ::~vector(&local_100.child_states.
                     super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                   );
          ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_100);
        }
        this_02 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
        TransactionData::TransactionData(&local_b0,this_00);
        transaction.transaction_id = local_b0.transaction_id;
        transaction.transaction.ptr = local_b0.transaction.ptr;
        transaction.start_time = local_b0.start_time;
        iVar5 = RowGroupCollection::Delete(this_02,transaction,this,ids,iVar6);
      }
      else {
        if (state->has_delete_constraints == true) {
          local_100.handles._M_h._M_buckets = &local_100.handles._M_h._M_single_bucket;
          local_100.handles._M_h._M_bucket_count = 1;
          local_100.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_100.handles._M_h._M_element_count = 0;
          local_100.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_100.child_states.
          super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_100.child_states.
          super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_100.handles._M_h._M_rehash_policy._M_next_resize = 0;
          local_100.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
          local_100.child_states.
          super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          LocalStorage::FetchChunk(this_01,this,&local_98,iVar6,&state->col_ids,result,&local_100);
          VerifyDeleteConstraints(this,storage,state,context,result);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ::~vector(&local_100.child_states.
                     super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                   );
          ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_100);
        }
        iVar5 = LocalStorage::Delete(this_01,this,&local_98,iVar6);
      }
      if (local_98.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_98.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_158 = local_158 + iVar5;
      LogicalType::~LogicalType(&local_98.type);
      iVar5 = end;
    } while (end < count);
  }
  return local_158;
}

Assistant:

idx_t DataTable::Delete(TableDeleteState &state, ClientContext &context, Vector &row_identifiers, idx_t count) {
	D_ASSERT(row_identifiers.GetType().InternalType() == ROW_TYPE);
	if (count == 0) {
		return 0;
	}

	auto &transaction = DuckTransaction::Get(context, db);
	auto &local_storage = LocalStorage::Get(transaction);
	auto storage = local_storage.GetStorage(*this);

	row_identifiers.Flatten(count);
	auto ids = FlatVector::GetData<row_t>(row_identifiers);

	idx_t pos = 0;
	idx_t delete_count = 0;
	while (pos < count) {
		idx_t start = pos;
		bool is_transaction_delete = ids[pos] >= MAX_ROW_ID;
		// figure out which batch of rows to delete now
		for (pos++; pos < count; pos++) {
			bool row_is_transaction_delete = ids[pos] >= MAX_ROW_ID;
			if (row_is_transaction_delete != is_transaction_delete) {
				break;
			}
		}
		idx_t current_offset = start;
		idx_t current_count = pos - start;

		Vector offset_ids(row_identifiers, current_offset, pos);

		// This is a transaction-local DELETE.
		if (is_transaction_delete) {
			if (state.has_delete_constraints) {
				// Verify any delete constraints.
				ColumnFetchState fetch_state;
				local_storage.FetchChunk(*this, offset_ids, current_count, state.col_ids, state.verify_chunk,
				                         fetch_state);
				VerifyDeleteConstraints(storage, state, context, state.verify_chunk);
			}
			delete_count += local_storage.Delete(*this, offset_ids, current_count);
			continue;
		}

		// This is a regular DELETE.
		if (state.has_delete_constraints) {
			// Verify any delete constraints.
			ColumnFetchState fetch_state;
			Fetch(transaction, state.verify_chunk, state.col_ids, offset_ids, current_count, fetch_state);
			VerifyDeleteConstraints(storage, state, context, state.verify_chunk);
		}
		delete_count += row_groups->Delete(transaction, *this, ids + current_offset, current_count);
	}
	return delete_count;
}